

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

int __thiscall DLevelScript::DoClassifyActor(DLevelScript *this,int tid)

{
  bool bVar1;
  uint uVar2;
  TFlags<ActorFlag,_unsigned_int> local_48;
  TFlags<ActorFlag3,_unsigned_int> local_44;
  undefined1 local_40 [8];
  FActorIterator it;
  APlayerPawn *pAStack_28;
  int classify;
  AActor *actor;
  int tid_local;
  DLevelScript *this_local;
  
  if (tid == 0) {
    pAStack_28 = (APlayerPawn *)::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->activator);
    if (pAStack_28 == (APlayerPawn *)0x0) {
      return 1;
    }
  }
  else {
    FActorIterator::FActorIterator((FActorIterator *)local_40,tid);
    pAStack_28 = (APlayerPawn *)FActorIterator::Next((FActorIterator *)local_40);
  }
  if (pAStack_28 == (APlayerPawn *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    it._12_4_ = 0;
    if ((pAStack_28->super_AActor).player == (player_t *)0x0) {
      TFlags<ActorFlag3,_unsigned_int>::operator&
                (&local_44,
                 (int)pAStack_28 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG)
                );
      uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_44);
      if (uVar2 == 0) {
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_48,
                   (int)pAStack_28 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
        uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_48);
        if (uVar2 == 0) {
          it._12_4_ = it._12_4_ | 0x100;
        }
        else {
          it._12_4_ = it._12_4_ | 0x80;
        }
      }
      else if ((pAStack_28->super_AActor).health < 1) {
        it._12_4_ = it._12_4_ | 0x50;
      }
      else {
        it._12_4_ = it._12_4_ | 0x30;
      }
    }
    else {
      if (((pAStack_28->super_AActor).player)->playerstate == '\x01') {
        it._12_4_ = 0x42;
      }
      else {
        it._12_4_ = 0x22;
      }
      if (((pAStack_28->super_AActor).player)->mo != pAStack_28) {
        it._12_4_ = it._12_4_ | 8;
      }
      bVar1 = TObjPtr<DBot>::operator!=(&((pAStack_28->super_AActor).player)->Bot,(DBot *)0x0);
      if (bVar1) {
        it._12_4_ = it._12_4_ | 4;
      }
    }
    this_local._4_4_ = it._12_4_;
  }
  return this_local._4_4_;
}

Assistant:

int DLevelScript::DoClassifyActor(int tid)
{
	AActor *actor;
	int classify;

	if (tid == 0)
	{
		actor = activator;
		if (actor == NULL)
		{
			return ACTOR_WORLD;
		}
	}
	else
	{
		FActorIterator it(tid);
		actor = it.Next();
	}
	if (actor == NULL)
	{
		return ACTOR_NONE;
	}

	classify = 0;
	if (actor->player != NULL)
	{
		classify |= ACTOR_PLAYER;
		if (actor->player->playerstate == PST_DEAD)
		{
			classify |= ACTOR_DEAD;
		}
		else
		{
			classify |= ACTOR_ALIVE;
		}
		if (actor->player->mo != actor)
		{
			classify |= ACTOR_VOODOODOLL;
		}
		if (actor->player->Bot != NULL)
		{
			classify |= ACTOR_BOT;
		}
	}
	else if (actor->flags3 & MF3_ISMONSTER)
	{
		classify |= ACTOR_MONSTER;
		if (actor->health <= 0)
		{
			classify |= ACTOR_DEAD;
		}
		else
		{
			classify |= ACTOR_ALIVE;
		}
	}
	else if (actor->flags & MF_MISSILE)
	{
		classify |= ACTOR_MISSILE;
	}
	else
	{
		classify |= ACTOR_GENERIC;
	}
	return classify;
}